

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_2.h
# Opt level: O1

int __thiscall
dlib::sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>::
remove(sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>
       *this,char *__filename)

{
  node *pnVar1;
  document_handler *pdVar2;
  node *pnVar3;
  node *pnVar4;
  int iVar5;
  undefined8 *in_RDX;
  
  move_to_pos(this,&this->current_node,&this->current_pos,(unsigned_long)__filename,
              this->sequence_size);
  pnVar1 = this->current_node;
  pdVar2 = pnVar1->item;
  pnVar1->item = (document_handler *)*in_RDX;
  *in_RDX = pdVar2;
  pnVar3 = this->current_node;
  pnVar4 = pnVar1->left;
  pnVar4->right = pnVar1->right;
  pnVar1 = pnVar1->right;
  pnVar1->left = pnVar4;
  this->current_node = pnVar1;
  this->sequence_size = this->sequence_size - 1;
  if (pnVar3 != (node *)0x0) {
    operator_delete(pnVar3);
  }
  iVar5 = (*(this->super_enumerable<dlib::document_handler_*>)._vptr_enumerable[3])(this);
  return iVar5;
}

Assistant:

void sequence_kernel_2<T,mem_manager>::
    remove (
        unsigned long pos,
        T& item
    )
    {
        move_to_pos(current_node,current_pos,pos,sequence_size);
        node& c_node = *current_node;
        exchange(c_node.item,item);
        
        node* temp = current_node;
        
        // close up gap left by remove
        c_node.left->right = c_node.right;
        c_node.right->left = c_node.left;

        current_node = c_node.right;

        --sequence_size;

        delete temp;
        // reset the enumerator
        reset();
    }